

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_handle_lifetime.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZEHandleLifetimeValidation::zeContextMakeMemoryResidentPrologue
          (ZEHandleLifetimeValidation *this,ze_context_handle_t hContext,ze_device_handle_t hDevice,
          void *ptr,size_t size)

{
  long lVar1;
  ze_result_t zVar2;
  iterator iVar3;
  iterator iVar4;
  ze_context_handle_t local_18;
  
  lVar1 = context;
  local_18 = hContext;
  iVar3 = std::
          _Hashtable<_ze_context_handle_t_*,_std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_context_handle_t_*>,_std::hash<_ze_context_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<_ze_context_handle_t_*,_std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_context_handle_t_*>,_std::hash<_ze_context_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(*(long *)(context + 0xd48) + 0x50),&local_18);
  if (iVar3.
      super__Node_iterator_base<std::pair<_ze_context_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    zVar2 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else {
    local_18 = (ze_context_handle_t)hDevice;
    iVar4 = std::
            _Hashtable<_ze_device_handle_t_*,_std::pair<_ze_device_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_device_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_device_handle_t_*>,_std::hash<_ze_device_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<_ze_device_handle_t_*,_std::pair<_ze_device_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_std::allocator<std::pair<_ze_device_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<_ze_device_handle_t_*>,_std::hash<_ze_device_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)(*(long *)(lVar1 + 0xd48) + 0xc0),(key_type *)&local_18);
    zVar2 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
    if (iVar4.
        super__Node_iterator_base<std::pair<_ze_device_handle_t_*const,_std::unique_ptr<validation_layer::_zel_handle_state_t,_std::default_delete<validation_layer::_zel_handle_state_t>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      zVar2 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar2;
}

Assistant:

ze_result_t
    ZEHandleLifetimeValidation::zeContextMakeMemoryResidentPrologue(
        ze_context_handle_t hContext,                   ///< [in] handle of context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        void* ptr,                                      ///< [in] pointer to memory to make resident
        size_t size                                     ///< [in] size in bytes to make resident
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hContext )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        if ( !context.handleLifetime->isHandleValid( hDevice )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }